

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O0

bool __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::is_input_collinear
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,Direction limiting_direction,
          size_t limiting_dof)

{
  double dVar1;
  double dVar2;
  undefined8 this_00;
  bool bVar3;
  uint uVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  unsigned_long *puVar9;
  Vector<double> *pVVar10;
  Vector<double> *pVVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  value_type_conflict2 local_150;
  value_type_conflict2 local_148;
  double current_scale;
  size_t dof_2;
  double control_limiting;
  double scale_limiting;
  double af_scale;
  double a0_scale;
  double vf_scale;
  double v0_scale;
  double pd_scale;
  double scale;
  _Storage<unsigned_long,_true> local_a0;
  _Storage<unsigned_long,_true> local_98;
  _Storage<unsigned_long,_true> local_90;
  _Storage<unsigned_long,_true> local_88;
  _Storage<unsigned_long,_true> local_80;
  _Storage<unsigned_long,_true> local_78;
  _Storage<unsigned_long,_true> local_70;
  _Storage<unsigned_long,_true> local_68;
  _Storage<unsigned_long,_true> local_60;
  unsigned_long local_58;
  size_t dof_1;
  optional<unsigned_long> scale_dof;
  Vector<double> *scale_vector;
  size_t dof;
  size_t limiting_dof_local;
  Direction limiting_direction_local;
  InputParameter<3UL,_ruckig::StandardVector> *inp_local;
  TargetCalculator<3UL,_ruckig::StandardVector> *this_local;
  
  for (scale_vector = (Vector<double> *)0x0;
      scale_vector < (Vector<double> *)this->degrees_of_freedom;
      scale_vector = (Vector<double> *)((long)scale_vector->_M_elems + 1)) {
    pvVar5 = std::array<double,_3UL>::operator[](&inp->target_position,(size_type)scale_vector);
    dVar1 = *pvVar5;
    pvVar5 = std::array<double,_3UL>::operator[](&inp->current_position,(size_type)scale_vector);
    dVar2 = *pvVar5;
    pvVar6 = std::array<double,_3UL>::operator[](&this->pd,(size_type)scale_vector);
    *pvVar6 = dVar1 - dVar2;
  }
  scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = 0;
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)&dof_1);
  local_58 = 0;
  do {
    if (this->degrees_of_freedom <= local_58) {
LAB_001560e2:
      bVar3 = std::optional::operator_cast_to_bool((optional *)&dof_1);
      this_00 = scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_;
      if (bVar3) {
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[]((array<double,_3UL> *)this_00,*puVar9);
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[](&this->pd,*puVar9);
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[](&inp->current_velocity,*puVar9);
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[](&inp->target_velocity,*puVar9);
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[](&inp->current_acceleration,*puVar9);
        puVar9 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&dof_1);
        std::array<double,_3UL>::operator[](&inp->target_acceleration,*puVar9);
        pvVar5 = std::array<double,_3UL>::operator[]
                           ((array<double,_3UL> *)
                            scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._8_8_,limiting_dof);
        dVar1 = *pvVar5;
        if (limiting_direction == UP) {
          pvVar5 = std::array<double,_3UL>::operator[](&inp->max_jerk,limiting_dof);
          local_148 = *pvVar5;
        }
        else {
          pvVar5 = std::array<double,_3UL>::operator[](&inp->max_jerk,limiting_dof);
          local_148 = -*pvVar5;
        }
        dof_2 = (size_t)local_148;
        pvVar5 = std::array<double,_3UL>::operator[](&inp->max_jerk,limiting_dof);
        uVar4 = std::isinf(*pvVar5);
        if ((uVar4 & 1) != 0) {
          if (limiting_direction == UP) {
            pvVar5 = std::array<double,_3UL>::operator[](&inp->max_acceleration,limiting_dof);
            local_150 = *pvVar5;
          }
          else {
            pvVar6 = std::array<double,_3UL>::operator[](&this->inp_min_acceleration,limiting_dof);
            local_150 = *pvVar6;
          }
          dof_2 = (size_t)local_150;
        }
        for (current_scale = 0.0; (ulong)current_scale < this->degrees_of_freedom;
            current_scale = (double)((long)current_scale + 1)) {
          pvVar7 = std::array<ruckig::Synchronization,_3UL>::operator[]
                             (&this->inp_per_dof_synchronization,(size_type)current_scale);
          if (*pvVar7 == Phase) {
            pvVar5 = std::array<double,_3UL>::operator[]
                               ((array<double,_3UL> *)
                                scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                .super__Optional_payload_base<unsigned_long>._8_8_,
                                (size_type)current_scale);
            dVar2 = *pvVar5;
            pvVar8 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                               (&this->inp_per_dof_control_interface,(size_type)current_scale);
            if (*pvVar8 == Position) {
              pVVar10 = &this->pd;
              std::array<double,_3UL>::operator[](pVVar10,(size_type)current_scale);
              std::abs((int)pVVar10);
              if (2.220446049250313e-16 < extraout_XMM0_Qa_04) {
                return false;
              }
            }
            pVVar11 = &inp->current_velocity;
            std::array<double,_3UL>::operator[](pVVar11,(size_type)current_scale);
            std::abs((int)pVVar11);
            if (2.220446049250313e-16 < extraout_XMM0_Qa_05) {
              return false;
            }
            pVVar11 = &inp->current_acceleration;
            std::array<double,_3UL>::operator[](pVVar11,(size_type)current_scale);
            std::abs((int)pVVar11);
            if (2.220446049250313e-16 < extraout_XMM0_Qa_06) {
              return false;
            }
            pVVar11 = &inp->target_velocity;
            std::array<double,_3UL>::operator[](pVVar11,(size_type)current_scale);
            std::abs((int)pVVar11);
            if (2.220446049250313e-16 < extraout_XMM0_Qa_07) {
              return false;
            }
            pVVar11 = &inp->target_acceleration;
            std::array<double,_3UL>::operator[](pVVar11,(size_type)current_scale);
            std::abs((int)pVVar11);
            if (2.220446049250313e-16 < extraout_XMM0_Qa_08) {
              return false;
            }
            pvVar6 = std::array<double,_3UL>::operator[]
                               (&this->new_phase_control,(size_type)current_scale);
            *pvVar6 = ((double)dof_2 * dVar2) / dVar1;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    pvVar7 = std::array<ruckig::Synchronization,_3UL>::operator[]
                       (&this->inp_per_dof_synchronization,local_58);
    if (*pvVar7 == Phase) {
      pvVar8 = std::array<ruckig::ControlInterface,_3UL>::operator[]
                         (&this->inp_per_dof_control_interface,local_58);
      if (*pvVar8 == Position) {
        pVVar10 = &this->pd;
        std::array<double,_3UL>::operator[](pVVar10,local_58);
        std::abs((int)pVVar10);
        if (2.220446049250313e-16 < extraout_XMM0_Qa) {
          scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_8_ = &this->pd;
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)&local_68,&local_58);
          dof_1 = local_68._M_value;
          scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload = local_60;
          goto LAB_001560e2;
        }
      }
      pVVar11 = &inp->current_velocity;
      std::array<double,_3UL>::operator[](pVVar11,local_58);
      std::abs((int)pVVar11);
      if (2.220446049250313e-16 < extraout_XMM0_Qa_00) {
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = &inp->current_velocity;
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)&local_78,&local_58);
        dof_1 = local_78._M_value;
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload = local_70;
        goto LAB_001560e2;
      }
      pVVar11 = &inp->current_acceleration;
      std::array<double,_3UL>::operator[](pVVar11,local_58);
      std::abs((int)pVVar11);
      if (2.220446049250313e-16 < extraout_XMM0_Qa_01) {
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = &inp->current_acceleration;
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)&local_88,&local_58);
        dof_1 = local_88._M_value;
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload = local_80;
        goto LAB_001560e2;
      }
      pVVar11 = &inp->target_velocity;
      std::array<double,_3UL>::operator[](pVVar11,local_58);
      std::abs((int)pVVar11);
      if (2.220446049250313e-16 < extraout_XMM0_Qa_02) {
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = &inp->target_velocity;
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)&local_98,&local_58);
        dof_1 = local_98._M_value;
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload = local_90;
        goto LAB_001560e2;
      }
      pVVar11 = &inp->target_acceleration;
      std::array<double,_3UL>::operator[](pVVar11,local_58);
      std::abs((int)pVVar11);
      if (2.220446049250313e-16 < extraout_XMM0_Qa_03) {
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._8_8_ = &inp->target_acceleration;
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)&scale,&local_58);
        dof_1 = (size_t)scale;
        scale_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload = local_a0;
        goto LAB_001560e2;
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

bool is_input_collinear(const InputParameter<DOFs, CustomVector>& inp, Profile::Direction limiting_direction, size_t limiting_dof) {
        // Check that vectors pd, v0, a0, vf, af are collinear
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            pd[dof] = inp.target_position[dof] - inp.current_position[dof];
        }

        const Vector<double>* scale_vector = nullptr;
        std::optional<size_t> scale_dof; // Need to find a scale DOF because limiting DOF might not be phase synchronized
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            if (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof]) > eps) {
                scale_vector = &pd;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_velocity[dof]) > eps) {
                scale_vector = &inp.current_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_acceleration[dof]) > eps) {
                scale_vector = &inp.current_acceleration;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_velocity[dof]) > eps) {
                scale_vector = &inp.target_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_acceleration[dof]) > eps) {
                scale_vector = &inp.target_acceleration;
                scale_dof = dof;
                break;
            }
        }

        if (!scale_dof) {
            return false; // Zero everywhere is in theory collinear, but that trivial case is better handled elsewhere
        }

        const double scale = scale_vector->operator[](*scale_dof);
        const double pd_scale = pd[*scale_dof] / scale;
        const double v0_scale = inp.current_velocity[*scale_dof] / scale;
        const double vf_scale = inp.target_velocity[*scale_dof] / scale;
        const double a0_scale = inp.current_acceleration[*scale_dof] / scale;
        const double af_scale = inp.target_acceleration[*scale_dof] / scale;

        const double scale_limiting = scale_vector->operator[](limiting_dof);
        double control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_jerk[limiting_dof] : -inp.max_jerk[limiting_dof];
        if (std::isinf(inp.max_jerk[limiting_dof])) {
            control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_acceleration[limiting_dof] : inp_min_acceleration[limiting_dof];
        }

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            const double current_scale = scale_vector->operator[](dof);
            if (
                (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof] - pd_scale * current_scale) > eps)
                || std::abs(inp.current_velocity[dof] - v0_scale * current_scale) > eps
                || std::abs(inp.current_acceleration[dof] - a0_scale * current_scale) > eps
                || std::abs(inp.target_velocity[dof] - vf_scale * current_scale) > eps
                || std::abs(inp.target_acceleration[dof] - af_scale * current_scale) > eps
            ) {
                return false;
            }

            new_phase_control[dof] = control_limiting * current_scale / scale_limiting;
        }

        return true;
    }